

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

String __thiscall testing::internal::FormatForFailureMessage(internal *this,char ch)

{
  size_t extraout_RDX;
  undefined7 in_register_00000031;
  ulong uVar2;
  String SVar3;
  char *local_28 [2];
  size_t sVar1;
  
  uVar2 = CONCAT71(in_register_00000031,ch);
  if (ch == '\0') {
    local_28[0] = "\\0";
  }
  else {
    String::Format((char *)local_28,"%c",uVar2 & 0xffffffff);
  }
  SVar3 = String::Format((char *)this,"\'%s\' (%u, 0x%X)",local_28[0],uVar2 & 0xffffffff,
                         uVar2 & 0xffffffff);
  sVar1 = SVar3.length_;
  if ((ch != '\0') && (local_28[0] != (char *)0x0)) {
    operator_delete__(local_28[0]);
    sVar1 = extraout_RDX;
  }
  SVar3.length_ = sVar1;
  SVar3.c_str_ = (char *)this;
  return SVar3;
}

Assistant:

String FormatForFailureMessage(char ch) {
  const unsigned int ch_as_uint = ch;
  // A String object cannot contain '\0', so we print "\\0" when ch is
  // '\0'.
  return String::Format("'%s' (%u, 0x%X)",
                        ch ? String::Format("%c", ch).c_str() : "\\0",
                        ch_as_uint, ch_as_uint);
}